

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O0

void __thiscall
Storage::Disk::IPF::add_raw_data
          (IPF *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *track,
          Time bit_length,size_t num_bits)

{
  byte bVar1;
  reference pvVar2;
  ulong __n;
  size_type sVar3;
  ulong uStack_40;
  uint8_t next;
  size_t bit;
  size_t num_bits_ceiling;
  value_type *segment;
  size_t num_bits_local;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *track_local;
  IPF *this_local;
  Time bit_length_local;
  
  pvVar2 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
           emplace_back<>(track);
  pvVar2->length_of_a_bit = bit_length;
  __n = num_bits + 7 & 0xfffffffffffffff8;
  std::vector<bool,_std::allocator<bool>_>::reserve(&pvVar2->data,__n);
  for (uStack_40 = 0; uStack_40 < num_bits; uStack_40 = uStack_40 + 8) {
    bVar1 = FileHolder::get8(&this->file_);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 0x80) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 0x40) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 0x20) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 0x10) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 8) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 4) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 2) != 0);
    std::vector<bool,_std::allocator<bool>_>::push_back(&pvVar2->data,(bVar1 & 1) != 0);
  }
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(&pvVar2->data);
  if (sVar3 <= __n) {
    std::vector<bool,_std::allocator<bool>_>::resize(&pvVar2->data,num_bits,false);
    return;
  }
  __assert_fail("segment.data.size() <= num_bits_ceiling",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                ,0x1b5,
                "void Storage::Disk::IPF::add_raw_data(std::vector<Storage::Disk::PCMSegment> &, Time, size_t)"
               );
}

Assistant:

void IPF::add_raw_data(std::vector<Storage::Disk::PCMSegment> &track, Time bit_length, size_t num_bits) {
	auto &segment = track.emplace_back();
	segment.length_of_a_bit = bit_length;

	const auto num_bits_ceiling = size_t(num_bits + 7) & size_t(~7);
	segment.data.reserve(num_bits_ceiling);

	for(size_t bit = 0; bit < num_bits; bit += 8) {
		const uint8_t next = file_.get8();
		segment.data.push_back(next & 0x80);
		segment.data.push_back(next & 0x40);
		segment.data.push_back(next & 0x20);
		segment.data.push_back(next & 0x10);
		segment.data.push_back(next & 0x08);
		segment.data.push_back(next & 0x04);
		segment.data.push_back(next & 0x02);
		segment.data.push_back(next & 0x01);
	}

	assert(segment.data.size() <= num_bits_ceiling);
	segment.data.resize(num_bits);
}